

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
ins_ekf::InsEkf::GetStates
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,InsEkf *this)

{
  Scalar *__x;
  CoeffReturnType pdVar1;
  int local_58;
  int local_54;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  undefined1 local_38 [8];
  Vector3d orientation;
  InsEkf *this_local;
  vector<double,_std::allocator<double>_> *states;
  
  orientation.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
  ._7_1_ = 0;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  QuatToRPY((Vector3d *)local_38,&this->orientation_);
  for (i_2 = 0; i_2 < 3; i_2 = i_2 + 1) {
    __x = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_38,(long)i_2)
    ;
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,__x);
  }
  for (i_3 = 0; i_3 < 3; i_3 = i_3 + 1) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)&this->position_
                        ,(long)i_3);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,pdVar1);
  }
  for (i_4 = 0; i_4 < 3; i_4 = i_4 + 1) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)&this->velocity_
                        ,(long)i_4);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,pdVar1);
  }
  for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)&this->bias_g_,
                        (long)local_54);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,pdVar1);
  }
  for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)&this->bias_a_,
                        (long)local_58);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,pdVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> InsEkf::GetStates() const {

        std::vector<double> states;
        Eigen::Vector3d orientation = QuatToRPY(orientation_);

        for(auto i = 0; i < 3; ++i)
            states.push_back(orientation[i]);
        for(auto i = 0; i < 3; ++i)
            states.push_back(position_[i]);
        for(auto i = 0; i < 3; ++i)
            states.push_back(velocity_[i]);
        for(auto i = 0; i < 3; ++i)
            states.push_back(bias_g_[i]);
        for(auto i = 0; i < 3; ++i)
            states.push_back(bias_a_[i]);

        return states;
    }